

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O3

void __thiscall
xray_re::xr_reader::
r_chunks<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,read_item>
          (xr_reader *this,
          vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *container)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t id;
  read_item local_79;
  xr_reader *local_78;
  sector_item local_70;
  
  local_78 = open_chunk(this,0);
  if (local_78 != (xr_reader *)0x0) {
    paVar1 = &local_70.object.field_2;
    paVar2 = &local_70.mesh.field_2;
    id = 1;
    do {
      local_70.mesh.field_2._8_8_ = 0;
      local_70.mesh._M_string_length = 0;
      local_70.object.field_2._M_allocated_capacity = 0;
      local_70.object.field_2._8_8_ = 0;
      local_70.object._M_string_length = 0;
      local_70.mesh.field_2._M_allocated_capacity = 0;
      local_70.object._M_dataplus._M_p = (pointer)paVar1;
      local_70.mesh._M_dataplus._M_p = (pointer)paVar2;
      std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::
      emplace_back<xray_re::sector_item>(container,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.mesh._M_dataplus._M_p != paVar2) {
        operator_delete(local_70.mesh._M_dataplus._M_p,
                        local_70.mesh.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.object._M_dataplus._M_p != paVar1) {
        operator_delete(local_70.object._M_dataplus._M_p,
                        local_70.object.field_2._M_allocated_capacity + 1);
      }
      read_item::operator()
                (&local_79,
                 (container->
                 super__Vector_base<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>).
                 _M_impl.super__Vector_impl_data._M_finish + -1,local_78);
      close_chunk(this,&local_78);
      local_78 = open_chunk(this,id);
      id = id + 1;
    } while (local_78 != (xr_reader *)0x0);
  }
  return;
}

Assistant:

inline void xr_reader::r_chunks(T& container, F read)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = open_chunk(id)); ++id) {
		container.push_back(typename T::value_type());
		read(container.back(), *s);
		close_chunk(s);
	}
}